

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boss.cpp
# Opt level: O2

istream * operator>>(istream *i,Boss *b)

{
  ostream *poVar1;
  allocator local_266;
  allocator local_265;
  int n;
  int workDone1;
  int workToDo1;
  int salaryPerHour1;
  int hourWork1;
  string local_250;
  string local_230;
  string id1;
  string name1;
  Employee e;
  Address a;
  Person p;
  
  name1._M_dataplus._M_p = (pointer)&name1.field_2;
  name1._M_string_length = 0;
  name1.field_2._M_local_buf[0] = '\0';
  id1._M_dataplus._M_p = (pointer)&id1.field_2;
  id1._M_string_length = 0;
  id1.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&e,"",(allocator *)&local_230);
  std::__cxx11::string::string((string *)&p,"",&local_266);
  std::__cxx11::string::string((string *)&local_250,"",&local_265);
  Address::Address(&a,(string *)&e,(string *)&p,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&p);
  std::__cxx11::string::~string((string *)&e);
  std::__cxx11::string::string((string *)&e,"",(allocator *)&local_230);
  std::__cxx11::string::string((string *)&local_250,"92*sa11178",&local_266);
  Person::Person(&p,(string *)&e,&local_250,&a);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&e);
  std::__cxx11::string::string((string *)&local_250,"",&local_266);
  std::__cxx11::string::string((string *)&local_230,"92*sa11178",&local_265);
  Employee::Employee(&e,&local_250,&local_230,&a,1,1,1,1);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::operator<<((ostream *)&std::cout,"Enter name: ");
  std::operator>>(i,(string *)&name1);
  std::operator<<((ostream *)&std::cout,"Enter id: ");
  std::operator>>(i,(string *)&id1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter address: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  operator>>(i,&a);
  Person::setName(&p,&name1);
  Person::setId(&p,&id1);
  Person::setAddress(&p,&a);
  std::operator<<((ostream *)&std::cout,"Enter hour work: ");
  std::istream::operator>>((istream *)i,&hourWork1);
  std::operator<<((ostream *)&std::cout,"Enter salary per hour: ");
  std::istream::operator>>((istream *)i,&salaryPerHour1);
  std::operator<<((ostream *)&std::cout,"Enter work to do: ");
  std::istream::operator>>((istream *)i,&workToDo1);
  std::operator<<((ostream *)&std::cout,"Enter work done: ");
  std::istream::operator>>((istream *)i,&workDone1);
  Employee::setSalaryPerHour(&e,salaryPerHour1);
  Employee::setHourWork(&e,hourWork1);
  Employee::setWorkDone(&e,workDone1);
  Employee::setWorkToDo(&e,workToDo1);
  std::operator<<((ostream *)&std::cout,"Enter number of employee: ");
  std::istream::operator>>((istream *)i,&n);
  b->numberOfEmployee = n;
  Person::~Person(&e.super_Person);
  Person::~Person(&p);
  Address::~Address(&a);
  std::__cxx11::string::~string((string *)&id1);
  std::__cxx11::string::~string((string *)&name1);
  return i;
}

Assistant:

std::istream &operator>>(istream &i, Boss &b) {

    int hourWork1, salaryPerHour1, workToDo1, workDone1;
    string name1, id1;
    int n;
    Address a("", "", "");
    Person p("", "92*sa11178", a);
    Employee e("", "92*sa11178", a, 1, 1, 1, 1);
    cout << "Enter name: ";
    i >> name1;
    cout << "Enter id: ";
    i >> id1;
    cout << "Enter address: " << endl;
    i >> a;
    p.setName(name1);
    p.setId(id1);
    p.setAddress(a);
    cout << "Enter hour work: ";
    i >> hourWork1;
    cout << "Enter salary per hour: ";
    i >> salaryPerHour1;
    cout << "Enter work to do: ";
    i >> workToDo1;
    cout << "Enter work done: ";
    i >> workDone1;
    e.setSalaryPerHour(salaryPerHour1);
    e.setHourWork(hourWork1);
    e.setWorkDone(workDone1);
    e.setWorkToDo(workToDo1);
    cout << "Enter number of employee: ";
    i >> n;
    b.setNumberOfEmployee(n);
    return i;

}